

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeMemAllocHostPrologue
          (ZEParameterValidation *this,ze_context_handle_t hContext,
          ze_host_mem_alloc_desc_t *host_desc,size_t size,size_t alignment,void **pptr)

{
  ze_result_t zVar1;
  
  if (hContext == (ze_context_handle_t)0x0) {
    return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  if ((pptr != (void **)0x0 && host_desc != (ze_host_mem_alloc_desc_t *)0x0) &&
     (zVar1 = ZE_RESULT_ERROR_INVALID_ENUMERATION, host_desc->flags < 0x10)) {
    if (size == 0) {
      return ZE_RESULT_ERROR_UNSUPPORTED_SIZE;
    }
    zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_ALIGNMENT;
    if ((alignment & alignment - 1) == 0) {
      zVar1 = ParameterValidation::validateExtensions<_ze_host_mem_alloc_desc_t_const*>(host_desc);
      return zVar1;
    }
  }
  return zVar1;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeMemAllocHostPrologue(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const ze_host_mem_alloc_desc_t* host_desc,      ///< [in] pointer to host memory allocation descriptor
        size_t size,                                    ///< [in] size in bytes to allocate; must be less than or equal to the
                                                        ///< `maxMemAllocSize` member of ::ze_device_properties_t
        size_t alignment,                               ///< [in] minimum alignment in bytes for the allocation; must be a power of
                                                        ///< two
        void** pptr                                     ///< [out] pointer to host allocation
        )
    {
        if( nullptr == hContext )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == host_desc )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pptr )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( 0xf < host_desc->flags )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        if( 0 == size )
            return ZE_RESULT_ERROR_UNSUPPORTED_SIZE;

        if( 0 != (alignment & (alignment - 1)) )
            return ZE_RESULT_ERROR_UNSUPPORTED_ALIGNMENT;

        return ParameterValidation::validateExtensions(host_desc);
    }